

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O3

SRes SZIP_ISeekInStream_Seek(void *p,Int64 *pos,ESzSeek origin)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  SRes SVar5;
  
  lVar1 = *(long *)((long)p + 0x10);
  SVar5 = 0xb;
  if (origin == SZ_SEEK_SET) {
    lVar4 = 0;
  }
  else {
    if (origin == SZ_SEEK_CUR) {
      lVar4 = 0x28;
    }
    else {
      if (origin != SZ_SEEK_END) {
        return 0xb;
      }
      lVar4 = 0x30;
    }
    lVar4 = (**(code **)(lVar1 + lVar4))(lVar1);
    if (lVar4 < 0) {
      return 0xb;
    }
  }
  lVar2 = *pos;
  if ((-1 < lVar2) || (SBORROW8(lVar4,-lVar2) == lVar4 + lVar2 < 0)) {
    iVar3 = (**(code **)(lVar1 + 0x20))(lVar1,lVar2 + lVar4);
    if (iVar3 != 0) {
      *pos = lVar2 + lVar4;
      SVar5 = 0;
    }
  }
  return SVar5;
}

Assistant:

static SRes SZIP_ISeekInStream_Seek(void *p, Int64 *pos, ESzSeek origin)
{
    SZIPLookToRead *stream = (SZIPLookToRead *) p;
    PHYSFS_Io *io = stream->io;
    PHYSFS_sint64 base;
    PHYSFS_uint64 newpos;

    switch (origin)
    {
        case SZ_SEEK_SET:
            base = 0;
            break;

        case SZ_SEEK_CUR:
            base = io->tell(io);
            break;

        case SZ_SEEK_END:
            base = io->length(io);
            break;

        default:
            return SZ_ERROR_FAIL;
    } /* switch */

    if (base < 0)
        return SZ_ERROR_FAIL;
    else if ((*pos < 0) && (((Int64) base) < -*pos))
        return SZ_ERROR_FAIL;

    newpos = (PHYSFS_uint64) (((Int64) base) + *pos);
    if (!io->seek(io, newpos))
        return SZ_ERROR_FAIL;

    *pos = (Int64) newpos;
    return SZ_OK;
}